

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

bool __thiscall
kj::MainBuilder::Impl::OptionDisplayOrder::operator()(OptionDisplayOrder *this,Option *a,Option *b)

{
  OptionName *pOVar1;
  StringPtr local_f0;
  OptionName *local_e0;
  OptionName *name_3;
  OptionName *__end2_3;
  OptionName *__begin2_3;
  ArrayPtr<kj::MainBuilder::OptionName> *__range2_3;
  OptionName *local_b0;
  OptionName *name_2;
  OptionName *__end2_2;
  OptionName *__begin2_2;
  ArrayPtr<kj::MainBuilder::OptionName> *__range2_2;
  StringPtr bLong;
  StringPtr aLong;
  OptionName *name_1;
  OptionName *__end2_1;
  OptionName *__begin2_1;
  ArrayPtr<kj::MainBuilder::OptionName> *__range2_1;
  OptionName *name;
  OptionName *__end2;
  OptionName *__begin2;
  ArrayPtr<kj::MainBuilder::OptionName> *__range2;
  char bShort;
  char aShort;
  Option *b_local;
  Option *a_local;
  OptionDisplayOrder *this_local;
  
  if (a == b) {
    this_local._7_1_ = false;
  }
  else {
    __range2._7_1_ = '\0';
    __range2._6_1_ = '\0';
    __end2 = ArrayPtr<kj::MainBuilder::OptionName>::begin(&a->names);
    pOVar1 = ArrayPtr<kj::MainBuilder::OptionName>::end(&a->names);
    for (; __end2 != pOVar1; __end2 = __end2 + 1) {
      if ((__end2->isLong & 1U) == 0) {
        __range2._7_1_ = (__end2->field_1).shortName;
        break;
      }
      if (__range2._7_1_ == '\0') {
        __range2._7_1_ = *(__end2->field_1).longName;
      }
    }
    __end2_1 = ArrayPtr<kj::MainBuilder::OptionName>::begin(&b->names);
    pOVar1 = ArrayPtr<kj::MainBuilder::OptionName>::end(&b->names);
    for (; __end2_1 != pOVar1; __end2_1 = __end2_1 + 1) {
      if ((__end2_1->isLong & 1U) == 0) {
        __range2._6_1_ = (__end2_1->field_1).shortName;
        break;
      }
      if (__range2._6_1_ == '\0') {
        __range2._6_1_ = *(__end2_1->field_1).longName;
      }
    }
    if (__range2._7_1_ < __range2._6_1_) {
      this_local._7_1_ = true;
    }
    else if (__range2._6_1_ < __range2._7_1_) {
      this_local._7_1_ = false;
    }
    else {
      StringPtr::StringPtr((StringPtr *)&bLong.content.size_);
      StringPtr::StringPtr((StringPtr *)&__range2_2);
      __begin2_2 = (OptionName *)a;
      __end2_2 = ArrayPtr<kj::MainBuilder::OptionName>::begin(&a->names);
      name_2 = ArrayPtr<kj::MainBuilder::OptionName>::end
                         ((ArrayPtr<kj::MainBuilder::OptionName> *)__begin2_2);
      for (; __end2_2 != name_2; __end2_2 = __end2_2 + 1) {
        local_b0 = __end2_2;
        if ((__end2_2->isLong & 1U) != 0) {
          StringPtr::StringPtr((StringPtr *)&__range2_3,(__end2_2->field_1).longName);
          bLong.content.size_ = (size_t)__range2_3;
          break;
        }
      }
      __begin2_3 = (OptionName *)b;
      __end2_3 = ArrayPtr<kj::MainBuilder::OptionName>::begin(&b->names);
      name_3 = ArrayPtr<kj::MainBuilder::OptionName>::end
                         ((ArrayPtr<kj::MainBuilder::OptionName> *)__begin2_3);
      for (; __end2_3 != name_3; __end2_3 = __end2_3 + 1) {
        local_e0 = __end2_3;
        if ((__end2_3->isLong & 1U) != 0) {
          StringPtr::StringPtr(&local_f0,(__end2_3->field_1).longName);
          __range2_2 = (ArrayPtr<kj::MainBuilder::OptionName> *)local_f0.content.ptr;
          bLong.content.ptr = (char *)local_f0.content.size_;
          break;
        }
      }
      this_local._7_1_ =
           StringPtr::operator<((StringPtr *)&bLong.content.size_,(StringPtr *)&__range2_2);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const Option* a, const Option* b) const {
    if (a == b) return false;

    char aShort = '\0';
    char bShort = '\0';

    for (auto& name: a->names) {
      if (name.isLong) {
        if (aShort == '\0') {
          aShort = name.longName[0];
        }
      } else {
        aShort = name.shortName;
        break;
      }
    }
    for (auto& name: b->names) {
      if (name.isLong) {
        if (bShort == '\0') {
          bShort = name.longName[0];
        }
      } else {
        bShort = name.shortName;
        break;
      }
    }

    if (aShort < bShort) return true;
    if (aShort > bShort) return false;

    StringPtr aLong;
    StringPtr bLong;

    for (auto& name: a->names) {
      if (name.isLong) {
        aLong = name.longName;
        break;
      }
    }
    for (auto& name: b->names) {
      if (name.isLong) {
        bLong = name.longName;
        break;
      }
    }

    return aLong < bLong;
  }